

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nonius.hpp
# Opt level: O3

string * nonius::detail::escape
                   (string *__return_storage_ptr__,string *source,
                   unordered_map<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<char>,_std::equal_to<char>,_std::allocator<std::pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *escapes)

{
  size_type sVar1;
  const_iterator cVar2;
  size_type sVar3;
  ulong uVar4;
  long lVar5;
  char *pcVar6;
  char *pcVar7;
  char *__k;
  _Hash_node_base *p_Var8;
  char *pcVar9;
  string magic;
  undefined1 *local_60;
  long local_58;
  undefined1 local_50;
  undefined7 uStack_4f;
  string *local_40;
  _Hashtable<char,_std::pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  *local_38;
  
  local_60 = &local_50;
  local_58 = 0;
  local_50 = 0;
  std::__cxx11::string::reserve((ulong)&local_60);
  p_Var8 = (escapes->_M_h)._M_before_begin._M_nxt;
  if (p_Var8 != (_Hash_node_base *)0x0) {
    do {
      std::__cxx11::string::push_back((char)&local_60);
      p_Var8 = p_Var8->_M_nxt;
    } while (p_Var8 != (_Hash_node_base *)0x0);
  }
  pcVar7 = (source->_M_dataplus)._M_p;
  sVar1 = source->_M_string_length;
  local_38 = &escapes->_M_h;
  if (sVar1 != 0) {
    sVar3 = 0;
    local_40 = source;
    do {
      std::__cxx11::string::find((char)&local_60,(ulong)(uint)(int)pcVar7[sVar3]);
      sVar3 = sVar3 + 1;
    } while (sVar1 != sVar3);
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  std::__cxx11::string::reserve((ulong)__return_storage_ptr__);
  if (sVar1 != 0) {
    pcVar9 = pcVar7 + sVar1;
    pcVar6 = pcVar7;
    do {
      do {
        if (local_58 != 0) {
          lVar5 = 0;
          do {
            __k = pcVar7;
            if (*pcVar7 == local_60[lVar5]) goto LAB_00142e32;
            lVar5 = lVar5 + 1;
          } while (local_58 != lVar5);
        }
        pcVar7 = pcVar7 + 1;
        __k = pcVar9;
      } while (pcVar7 != pcVar9);
LAB_00142e32:
      if (0 < (long)__k - (long)pcVar6) {
        uVar4 = ((long)__k - (long)pcVar6) + 1;
        do {
          std::__cxx11::string::push_back((char)__return_storage_ptr__);
          uVar4 = uVar4 - 1;
        } while (1 < uVar4);
      }
      if (__k == pcVar9) break;
      cVar2 = std::
              _Hashtable<char,_std::pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
              ::find(local_38,__k);
      if (cVar2.
          super__Node_iterator_base<std::pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
          ._M_cur != (__node_type *)0x0) {
        std::__cxx11::string::_M_append
                  ((char *)__return_storage_ptr__,
                   *(ulong *)((long)cVar2.
                                    super__Node_iterator_base<std::pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
                                    ._M_cur + 0x10));
      }
      pcVar7 = __k + 1;
      pcVar6 = pcVar7;
    } while (pcVar7 != pcVar9);
  }
  if (local_60 != &local_50) {
    operator_delete(local_60,CONCAT71(uStack_4f,local_50) + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

inline std::string escape(std::string const& source, std::unordered_map<char, std::string> const& escapes) {
            std::string magic;
            magic.reserve(escapes.size());
            std::transform(escapes.begin(), escapes.end(), std::back_inserter(magic), [](std::pair<char const, std::string> const& p) { return p.first; });

            auto first = source.begin();
            auto last = source.end();

            auto n_magic = std::count_if(first, last, [&magic](char c) { return magic.find(c) != std::string::npos; });

            std::string escaped;
            escaped.reserve(source.size() + n_magic*6);

            while(first != last) {
                auto next_magic = std::find_first_of(first, last, magic.begin(), magic.end());
                std::copy(first, next_magic, std::back_inserter(escaped));
                first = next_magic;
                if(first != last) {
                    auto it = escapes.find(*first);
                    if(it != escapes.end()) {
                        escaped += it->second;
                    }
                    ++first;
                }
            }
            return escaped;
        }